

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::BlockStatementSyntax::BlockStatementSyntax
          (BlockStatementSyntax *this,SyntaxKind kind,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token begin,
          NamedBlockClauseSyntax *blockName,SyntaxList<slang::syntax::SyntaxNode> *items,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  bool bVar1;
  reference ppSVar2;
  StatementSyntax *in_RCX;
  SyntaxNode *in_RDI;
  SyntaxNode *in_R8;
  undefined8 in_R9;
  SyntaxNode *in_stack_00000008;
  SyntaxNode *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::SyntaxNode> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::SyntaxNode> *)&child;
  StatementSyntax::StatementSyntax
            (in_RCX,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (NamedLabelSyntax *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  in_RDI[3].previewNode = in_R8;
  *(undefined8 *)(in_RDI + 4) = in_R9;
  in_RDI[4].parent = in_stack_00000008;
  SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(this_00,in_stack_ffffffffffffff98);
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[7].previewNode = (SyntaxNode *)__begin2._M_current;
  if (in_RDI[4].parent != (SyntaxNode *)0x0) {
    (in_RDI[4].parent)->parent = in_RDI;
  }
  in_RDI[5].parent = in_RDI;
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)in_stack_ffffffffffffff98)
  ;
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
            ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    (*ppSVar2)->parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  if (in_RDI[7].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[7].previewNode)->parent = in_RDI;
  }
  return;
}

Assistant:

BlockStatementSyntax(SyntaxKind kind, NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token begin, NamedBlockClauseSyntax* blockName, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        StatementSyntax(kind, label, attributes), begin(begin), blockName(blockName), items(items), end(end), endBlockName(endBlockName) {
        if (this->blockName) this->blockName->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }